

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_0::TestIgnorer::IsIgnored
          (TestIgnorer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  string_view sVar5;
  ulong local_130;
  size_t i_1;
  AlphaNum local_118;
  AlphaNum local_e8;
  string_view local_b8;
  AlphaNum local_a8;
  ulong local_78;
  size_t i;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string name;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  FieldDescriptor *field_local;
  Message *message2_local;
  Message *message1_local;
  TestIgnorer *this_local;
  
  name.field_2._8_8_ = parent_fields;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,anon_var_dwarf_37cdd0 + 5,&local_59);
  std::allocator<char>::~allocator(&local_59);
  local_78 = 0;
  while( true ) {
    uVar1 = local_78;
    sVar3 = std::
            vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ::size((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    *)name.field_2._8_8_);
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             ::operator[]((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           *)name.field_2._8_8_,local_78);
    sVar5 = FieldDescriptor::name(pvVar4->field);
    local_b8 = sVar5;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,sVar5);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,".");
    absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_58,&local_a8,&local_e8);
    local_78 = local_78 + 1;
  }
  sVar5 = FieldDescriptor::name(field);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_118,sVar5);
  absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_58,&local_118);
  local_130 = 0;
  do {
    if (1 < local_130) {
      this_local._7_1_ = false;
LAB_01183a8e:
      std::__cxx11::string::~string((string *)local_58);
      return this_local._7_1_;
    }
    __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    bVar2 = std::operator==(__x,*(basic_string_view<char,_std::char_traits<char>_> *)
                                 (protobuf::(anonymous_namespace)::kIgnoredFields + local_130 * 0x10
                                 ));
    if (bVar2) {
      this_local._7_1_ = true;
      goto LAB_01183a8e;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

bool IsIgnored(const Message& message1, const Message& message2,
                 const FieldDescriptor* field,
                 const std::vector<util::MessageDifferencer::SpecificField>&
                     parent_fields) override {
    std::string name = "";
    for (size_t i = 0; i < parent_fields.size(); ++i) {
      absl::StrAppend(&name, parent_fields[i].field->name(), ".");
    }
    absl::StrAppend(&name, field->name());
    for (size_t i = 0; i < ABSL_ARRAYSIZE(kIgnoredFields); ++i) {
      if (name == kIgnoredFields[i]) {
        return true;
      }
    }
    return false;
  }